

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

void vkt::pipeline::anon_unknown_0::addTestCasesWithFunctions
               (TestCaseGroup *group,Function initPrograms,Function testFunc)

{
  int iVar1;
  int iVar2;
  TestContext *pTVar3;
  _Alloc_hider name_00;
  _Alloc_hider description;
  TestNode *this;
  ostream *poVar4;
  TestNode *pTVar5;
  char *__s;
  TestNode *node;
  undefined8 uVar6;
  long lVar7;
  string name;
  string local_238;
  string local_218;
  int *local_1f8;
  TestNode *local_1f0;
  long local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  int local_1d0;
  VkFormat local_1cc;
  _func_int **local_1c8;
  TestContext *local_1c0;
  int local_1b8 [4];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  local_1f8 = local_1b8;
  local_1b8[0] = 0x40;
  local_1b8[1] = 0x40;
  local_1b8[2] = 0x4f;
  local_1b8[3] = 0x1f;
  uVar6 = CONCAT71((int7)((ulong)local_1f8 >> 8),1);
  local_1f0 = &group->super_TestNode;
  local_1c8 = (_func_int **)initPrograms;
  local_1c0 = (TestContext *)testFunc;
  do {
    local_1dc = (uint)uVar6;
    uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    lVar7 = 0;
    pTVar5 = local_1f0;
    do {
      local_1d8 = (uint)uVar6;
      this = (TestNode *)operator_new(0x70);
      pTVar3 = pTVar5->m_testCtx;
      iVar1 = (&DAT_00ae9134)[lVar7];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_1d0 = *local_1f8;
      poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"x",1);
      local_1d4 = local_1f8[1];
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1d4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      std::ostream::operator<<(poVar4,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,pTVar3,local_238._M_dataplus._M_p,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_1e8 = 0;
      do {
        pTVar5 = (TestNode *)operator_new(0x70);
        pTVar3 = local_1f0->m_testCtx;
        local_1cc = (&DAT_00ae8690)[local_1e8];
        __s = ::vk::getFormatName(local_1cc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,__s,(allocator<char> *)&local_238);
        std::__cxx11::string::substr((ulong)&local_238,(ulong)local_1a8);
        de::toLower(&local_218,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0],local_198[0] + 1);
        }
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar5,pTVar3,local_218._M_dataplus._M_p,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        lVar7 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"samples_",8);
          iVar2 = *(int *)((long)&DAT_00ae86e0 + lVar7);
          std::ostream::operator<<((ostringstream *)local_1a8,iVar2);
          std::__cxx11::stringbuf::str();
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          description._M_p = local_218._M_dataplus._M_p;
          name_00._M_p = local_238._M_dataplus._M_p;
          pTVar3 = pTVar5->m_testCtx;
          node = (TestNode *)operator_new(0x98);
          tcu::TestCase::TestCase
                    ((TestCase *)node,pTVar3,NODETYPE_SELF_VALIDATE,name_00._M_p,description._M_p);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d29720;
          node[1]._vptr_TestNode = local_1c8;
          node[1].m_testCtx = local_1c0;
          *(int *)&node[1].m_name._M_dataplus._M_p = local_1d0;
          *(int *)((long)&node[1].m_name._M_dataplus._M_p + 4) = local_1d4;
          *(int *)&node[1].m_name._M_string_length = iVar1;
          *(VkFormat *)((long)&node[1].m_name._M_string_length + 4) = local_1cc;
          *(int *)&node[1].m_name.field_2 = iVar2;
          tcu::TestNode::addChild(pTVar5,node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x18);
        tcu::TestNode::addChild(this,pTVar5);
        pTVar5 = local_1f0;
        local_1e8 = local_1e8 + 1;
      } while (local_1e8 != 4);
      tcu::TestNode::addChild(local_1f0,this);
      lVar7 = 1;
      uVar6 = 0;
    } while ((local_1d8 & 1) != 0);
    local_1f8 = local_1b8 + 2;
    uVar6 = 0;
  } while ((local_1dc & 1) != 0);
  return;
}

Assistant:

void addTestCasesWithFunctions (tcu::TestCaseGroup*						group,
								FunctionPrograms1<CaseDef>::Function	initPrograms,
								FunctionInstance1<CaseDef>::Function	testFunc)
{
	const IVec2 size[] =
	{
		IVec2(64, 64),
		IVec2(79, 31),
	};
	const int numLayers[] =
	{
		1, 4
	};
	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};
	const VkFormat format[] =
	{
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(size); ++sizeNdx)
	for (int layerNdx = 0; layerNdx < DE_LENGTH_OF_ARRAY(numLayers); ++layerNdx)
	{
		MovePtr<tcu::TestCaseGroup>	sizeLayerGroup(new tcu::TestCaseGroup(group->getTestContext(), getSizeLayerString(size[sizeNdx], numLayers[layerNdx]).c_str(), ""));
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(format); ++formatNdx)
		{
			MovePtr<tcu::TestCaseGroup>	formatGroup(new tcu::TestCaseGroup(group->getTestContext(), getFormatString(format[formatNdx]).c_str(), ""));
			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				std::ostringstream caseName;
				caseName << "samples_" << getNumSamples(samples[samplesNdx]);

				const CaseDef caseDef =
				{
					size[sizeNdx],			// IVec2					renderSize;
					numLayers[layerNdx],	// int						numLayers;
					format[formatNdx],		// VkFormat					colorFormat;
					samples[samplesNdx],	// VkSampleCountFlagBits	numSamples;
				};

				addFunctionCaseWithPrograms(formatGroup.get(), caseName.str(), "", initPrograms, testFunc, caseDef);
			}
			sizeLayerGroup->addChild(formatGroup.release());
		}
		group->addChild(sizeLayerGroup.release());
	}
}